

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten-finalize.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  string *psVar3;
  long lVar4;
  mapped_type *this;
  ostream *poVar5;
  bool local_1f7b;
  byte local_1f7a;
  string local_1cf0;
  string local_1cd0;
  undefined1 local_1cb0 [8];
  ModuleWriter writer;
  Output output;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1920;
  allocator<char> local_18f1;
  string local_18f0 [40];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18c8;
  allocator<char> local_1899;
  string local_1898 [40];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1870;
  allocator<char> local_1841;
  string local_1840 [40];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1818;
  allocator<char> local_17e9;
  string local_17e8 [40];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17c0;
  allocator<char> local_1791;
  string local_1790 [39];
  allocator<char> local_1769;
  key_type local_1768;
  PassOptions local_1748;
  PassRunner local_1690 [8];
  PassRunner passRunner;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1618 [2];
  Address local_15a0;
  undefined1 local_1598 [8];
  EmscriptenGlueGenerator generator;
  ParseException *p;
  MapParseException *p_1;
  string local_1230 [36];
  undefined1 local_120c [8];
  ModuleReader reader;
  Module wasm;
  undefined1 local_e08 [7];
  bool writeOutput;
  anon_class_8_1_5a8ed95f local_c80;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c78;
  allocator<char> local_c51;
  string local_c50 [32];
  anon_class_8_1_671dc377 local_c30;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c28;
  allocator<char> local_c01;
  string local_c00 [39];
  allocator<char> local_bd9;
  string local_bd8 [39];
  allocator<char> local_bb1;
  string local_bb0 [32];
  anon_class_8_1_36e7e97b local_b90;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b88;
  allocator<char> local_b61;
  string local_b60 [39];
  allocator<char> local_b39;
  string local_b38 [39];
  allocator<char> local_b11;
  string local_b10 [32];
  anon_class_8_1_3bf3b361 local_af0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ae8;
  allocator<char> local_ac1;
  string local_ac0 [39];
  allocator<char> local_a99;
  string local_a98 [39];
  allocator<char> local_a71;
  string local_a70 [32];
  anon_class_8_1_bc5f9ec7 local_a50;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a48;
  allocator<char> local_a21;
  string local_a20 [39];
  allocator<char> local_9f9;
  string local_9f8 [39];
  allocator<char> local_9d1;
  string local_9d0 [32];
  anon_class_8_1_ff35c540 local_9b0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9a8;
  allocator<char> local_981;
  string local_980 [39];
  allocator<char> local_959;
  string local_958 [39];
  allocator<char> local_931;
  string local_930 [32];
  anon_class_8_1_79fd1ccd local_910;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_908;
  allocator<char> local_8e1;
  string local_8e0 [39];
  allocator<char> local_8b9;
  string local_8b8 [39];
  allocator<char> local_891;
  string local_890 [32];
  anon_class_8_1_4038aa47 local_870;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_868;
  allocator<char> local_841;
  string local_840 [39];
  allocator<char> local_819;
  string local_818 [39];
  allocator<char> local_7f1;
  string local_7f0 [32];
  anon_class_8_1_4e56740d local_7d0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7c8;
  allocator<char> local_7a1;
  string local_7a0 [39];
  allocator<char> local_779;
  string local_778 [39];
  allocator<char> local_751;
  string local_750 [32];
  anon_class_8_1_348f3fc1 local_730;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_728;
  allocator<char> local_701;
  string local_700 [39];
  allocator<char> local_6d9;
  string local_6d8 [39];
  allocator<char> local_6b1;
  string local_6b0 [32];
  anon_class_8_1_97c9f8fc local_690;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_688;
  allocator<char> local_661;
  string local_660 [39];
  allocator<char> local_639;
  string local_638 [39];
  allocator<char> local_611;
  string local_610 [32];
  anon_class_8_1_27031c61 local_5f0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5e8;
  allocator<char> local_5c1;
  string local_5c0 [39];
  allocator<char> local_599;
  string local_598 [39];
  allocator<char> local_571;
  string local_570 [32];
  anon_class_8_1_29de6772 local_550;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_548;
  allocator<char> local_521;
  string local_520 [39];
  allocator<char> local_4f9;
  string local_4f8 [39];
  allocator<char> local_4d1;
  string local_4d0 [32];
  anon_class_8_1_a600b7e2 local_4b0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4a8;
  allocator<char> local_481;
  string local_480 [39];
  allocator<char> local_459;
  string local_458 [39];
  allocator<char> local_431;
  string local_430 [32];
  anon_class_8_1_09c29441 local_410;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_408;
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [39];
  allocator<char> local_391;
  string local_390 [32];
  anon_class_8_1_416780aa local_370;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_368;
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  undefined1 local_280 [8];
  ToolOptions options;
  allocator<char> local_e9;
  string local_e8 [8];
  string WasmEmscriptenFinalizeOption;
  bool local_c0;
  bool local_bf;
  bool local_be;
  bool local_bd;
  bool local_bc;
  bool onlyI64DynCalls;
  bool noDynCalls;
  bool minimizeWasmChanges;
  bool standaloneWasm;
  bool checkStackOverflow;
  bool bigInt;
  bool legalizeJavaScriptFFI;
  bool sideModule;
  bool DWARF;
  bool debugInfo;
  bool emitBinary;
  string outputSourceMapUrl;
  string outputSourceMapFilename;
  string inputSourceMapFilename;
  string outfile;
  string infile;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(outfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(inputSourceMapFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(outputSourceMapFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&standaloneWasm);
  minimizeWasmChanges = true;
  noDynCalls = false;
  onlyI64DynCalls = false;
  local_bc = false;
  local_bd = true;
  local_be = false;
  local_bf = false;
  local_c0 = false;
  WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xf] = '\0';
  WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xe] = '\0';
  WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xd] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e8,"wasm-emscripten-finalize options",&local_e9);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"wasm-emscripten-finalize",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"Performs Emscripten-specific transforms on .wasm files",
             &local_2c9);
  ::wasm::ToolOptions::ToolOptions((ToolOptions *)local_280,&local_2a0,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"--output",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_318,"-o",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_340,"Output file",&local_341);
  local_370.outfile = (string *)((long)&inputSourceMapFilename.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_368,&local_370);
  psVar3 = (string *)
           ::wasm::Options::add
                     ((string *)&options,local_2f0,local_318,local_340,(Arguments)local_e8,
                      (function *)0x1,SUB81(&local_368,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_390,"--debuginfo",&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"-g",&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e0,"Emit names section in wasm binary (or full debuginfo in wast)",&local_3e1);
  local_410.debugInfo = &noDynCalls;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_408,&local_410);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_390,local_3b8,local_3e0,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_408,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_430,"--dwarf",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_458,"",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_480,"Update DWARF debug info",&local_481)
  ;
  local_4b0.DWARF = &onlyI64DynCalls;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_4a8,&local_4b0);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_430,local_458,local_480,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_4a8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"--emit-text",&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"-S",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_520,
             "Emit text instead of binary for the output file. In this mode if no output file is specified, we write to stdout."
             ,&local_521);
  local_550.emitBinary = &minimizeWasmChanges;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_548,&local_550);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_4d0,local_4f8,local_520,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_548,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_570,"--side-module",&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_598,"",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c0,"Input is an emscripten side module",&local_5c1);
  local_5f0.sideModule = &local_bc;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__4,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_5e8,&local_5f0);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_570,local_598,local_5c0,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_5e8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_610,"--input-source-map",&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_638,"-ism",&local_639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_660,"Consume source map from the specified file",&local_661);
  local_690.inputSourceMapFilename = (string *)((long)&outputSourceMapFilename.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__5,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_688,&local_690);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_610,local_638,local_660,(Arguments)local_e8,(function *)0x1,
                      SUB81(&local_688,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6b0,"--no-legalize-javascript-ffi",&local_6b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6d8,"-nj",&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_700,
             "Do not fully legalize (i64->i32, f32->f64) the imports and exports for interfacing with JS"
             ,&local_701);
  local_730.legalizeJavaScriptFFI = &local_bd;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__6,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_728,&local_730);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_6b0,local_6d8,local_700,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_728,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_750,"--bigint",&local_751);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_778,"-bi",&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a0,
             "Assume JS will use wasm/JS BigInt integration, so wasm i64s will turn into JS BigInts, and there is no need for any legalization at all (not even minimal legalization of dynCalls)"
             ,&local_7a1);
  local_7d0.bigInt = &local_be;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__7,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_7c8,&local_7d0);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_750,local_778,local_7a0,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_7c8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7f0,"--output-source-map",&local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_818,"-osm",&local_819);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_840,"Emit source map to the specified file",&local_841);
  local_870.outputSourceMapFilename = (string *)((long)&outputSourceMapUrl.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__8,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_868,&local_870);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_7f0,local_818,local_840,(Arguments)local_e8,(function *)0x1,
                      SUB81(&local_868,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_890,"--output-source-map-url",&local_891)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8b8,"-osu",&local_8b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8e0,"Emit specified string as source map URL",&local_8e1);
  local_910.outputSourceMapUrl = (string *)&standaloneWasm;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__9,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_908,&local_910);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_890,local_8b8,local_8e0,(Arguments)local_e8,(function *)0x1,
                      SUB81(&local_908,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_930,"--check-stack-overflow",&local_931);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_958,"",&local_959);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_980,"Check for stack overflows every time the stack is extended",&local_981);
  local_9b0.checkStackOverflow = &local_bf;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__10,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_9a8,&local_9b0);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_930,local_958,local_980,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_9a8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9d0,"--standalone-wasm",&local_9d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9f8,"",&local_9f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a20,
             "Emit a wasm file that does not depend on JS, as much as possible, using wasi and other standard conventions etc. where possible"
             ,&local_a21);
  local_a50.standaloneWasm = &local_c0;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__11,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_a48,&local_a50);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_9d0,local_9f8,local_a20,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_a48,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a70,"--minimize-wasm-changes",&local_a71)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a98,"",&local_a99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ac0,
             "Modify the wasm as little as possible. This is useful during development as we reduce the number of changes to the wasm, as it lets emscripten control how much modifications to do."
             ,&local_ac1);
  local_af0.minimizeWasmChanges = (bool *)((long)&WasmEmscriptenFinalizeOption.field_2 + 0xf);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__12,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_ae8,&local_af0);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_a70,local_a98,local_ac0,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_ae8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b10,"--no-dyncalls",&local_b11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b38,"",&local_b39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b60,"",&local_b61);
  local_b90.noDynCalls = (bool *)((long)&WasmEmscriptenFinalizeOption.field_2 + 0xe);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__13,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_b88,&local_b90);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_b10,local_b38,local_b60,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_b88,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bb0,"--dyncalls-i64",&local_bb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bd8,"",&local_bd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c00,"",&local_c01);
  local_c30.onlyI64DynCalls = (bool *)((long)&WasmEmscriptenFinalizeOption.field_2 + 0xd);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__14,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_c28,&local_c30);
  psVar3 = (string *)
           ::wasm::Options::add
                     (psVar3,local_bb0,local_bd8,local_c00,(Arguments)local_e8,(function *)0x0,
                      SUB81(&local_c28,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c50,"INFILE",&local_c51);
  local_c80.infile = (string *)((long)&outfile.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__15,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_c78,&local_c80);
  ::wasm::Options::add_positional(psVar3,(Arguments)local_c50,(function *)0x1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c78);
  std::__cxx11::string::~string(local_c50);
  std::allocator<char>::~allocator(&local_c51);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c28);
  std::__cxx11::string::~string(local_c00);
  std::allocator<char>::~allocator(&local_c01);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator(&local_bd9);
  std::__cxx11::string::~string(local_bb0);
  std::allocator<char>::~allocator(&local_bb1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b88);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator(&local_b61);
  std::__cxx11::string::~string(local_b38);
  std::allocator<char>::~allocator(&local_b39);
  std::__cxx11::string::~string(local_b10);
  std::allocator<char>::~allocator(&local_b11);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_ae8);
  std::__cxx11::string::~string(local_ac0);
  std::allocator<char>::~allocator(&local_ac1);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator(&local_a99);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator(&local_a71);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a48);
  std::__cxx11::string::~string(local_a20);
  std::allocator<char>::~allocator(&local_a21);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator(&local_9f9);
  std::__cxx11::string::~string(local_9d0);
  std::allocator<char>::~allocator(&local_9d1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_9a8);
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator(&local_981);
  std::__cxx11::string::~string(local_958);
  std::allocator<char>::~allocator(&local_959);
  std::__cxx11::string::~string(local_930);
  std::allocator<char>::~allocator(&local_931);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_908);
  std::__cxx11::string::~string(local_8e0);
  std::allocator<char>::~allocator(&local_8e1);
  std::__cxx11::string::~string(local_8b8);
  std::allocator<char>::~allocator(&local_8b9);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator(&local_891);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_868);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator(&local_841);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator(&local_819);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator(&local_7f1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_7c8);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator(&local_779);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator(&local_751);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_728);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator(&local_701);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_688);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator(&local_661);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator(&local_611);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_5e8);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator(&local_571);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_548);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator(&local_521);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4a8);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_408);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_368);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  ::wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&outfile.field_2 + 8),"");
  if (bVar1) {
    ::wasm::Fatal::Fatal((Fatal *)local_e08);
    ::wasm::Fatal::operator<<((Fatal *)local_e08,(char (*) [27])"Need to specify an infile\n");
    ::wasm::Fatal::~Fatal((Fatal *)local_e08);
  }
  lVar4 = std::__cxx11::string::size();
  local_1f7a = 1;
  if (lVar4 == 0) {
    local_1f7a = minimizeWasmChanges ^ 0xff;
  }
  bVar1 = (bool)(local_1f7a & 1);
  ::wasm::Module::Module((Module *)&reader.profile);
  ::wasm::ToolOptions::applyOptionsBeforeParse((ToolOptions *)local_280,(Module *)&reader.profile);
  ::wasm::ModuleReader::ModuleReader((ModuleReader *)local_120c);
  ::wasm::ModuleIOBase::setDebugInfo((ModuleIOBase *)local_120c,bVar1);
  local_1f7b = false;
  if ((onlyI64DynCalls & 1U) != 0) {
    local_1f7b = bVar1;
  }
  ::wasm::ModuleReader::setDWARF((ModuleReader *)local_120c,local_1f7b);
  if (bVar1 == false) {
    ::wasm::ModuleReader::setSkipFunctionBodies((ModuleReader *)local_120c,true);
  }
  std::__cxx11::string::string(local_1230,(string *)(outfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)&p_1,(string *)(outputSourceMapFilename.field_2._M_local_buf + 8));
  ::wasm::ModuleReader::read(local_120c,local_1230,&reader.profile,&p_1);
  std::__cxx11::string::~string((string *)&p_1);
  std::__cxx11::string::~string(local_1230);
  ::wasm::ToolOptions::applyOptionsAfterParse((ToolOptions *)local_280,(Module *)&reader.profile);
  bVar2 = ::wasm::isDebugEnabled("emscripten-dump");
  if ((bVar2 & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"Module before:\n");
  }
  bVar2 = ::wasm::isDebugEnabled("emscripten-dump");
  if ((bVar2 & 1) != 0) {
    std::ostream::operator<<(&std::cerr,&reader.profile);
  }
  ::wasm::Address::Address(&local_15a0,0);
  ::wasm::EmscriptenGlueGenerator::EmscriptenGlueGenerator
            ((EmscriptenGlueGenerator *)local_1598,(Module *)&reader.profile,local_15a0);
  local_1598[0] = (bool)(local_c0 & 1);
  local_1598[1] = (bool)(local_bc & 1);
  local_1598[2] = (bool)(WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xf] & 1);
  local_1598[4] = (bool)(WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xd] & 1);
  local_1598[3] = (bool)(WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xe] & 1);
  ::wasm::PassOptions::PassOptions(&local_1748,(PassOptions *)&options.field_0xb0);
  ::wasm::PassRunner::PassRunner(local_1690,(Module *)&reader.profile,&local_1748);
  ::wasm::PassOptions::~PassOptions(&local_1748);
  ::wasm::PassRunner::setDebug(local_1690,(bool)((byte)options._vptr_ToolOptions & 1));
  ::wasm::PassRunner::setDebugInfo(local_1690,(bool)(noDynCalls & 1));
  if ((local_bf & 1U) != 0) {
    if ((local_c0 & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1768,"stack-check-handler",&local_1769);
      this = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_1618,&local_1768);
      std::__cxx11::string::operator=((string *)this,"__handle_stack_overflow");
      std::__cxx11::string::~string((string *)&local_1768);
      std::allocator<char>::~allocator(&local_1769);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1790,"stack-check",&local_1791);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ::wasm::PassRunner::add(local_1690,local_1790,&local_17c0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_17c0);
    std::__cxx11::string::~string(local_1790);
    std::allocator<char>::~allocator(&local_1791);
  }
  if (((WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xe] & 1U) == 0) && ((local_c0 & 1U) == 0)
     ) {
    if ((WasmEmscriptenFinalizeOption.field_2._M_local_buf[0xd] & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1840,"generate-dyncalls",&local_1841)
      ;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      ::wasm::PassRunner::add(local_1690,local_1840,&local_1870);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_1870);
      std::__cxx11::string::~string(local_1840);
      std::allocator<char>::~allocator(&local_1841);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_17e8,"generate-i64-dyncalls",&local_17e9);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      ::wasm::PassRunner::add(local_1690,local_17e8,&local_1818);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_1818);
      std::__cxx11::string::~string(local_17e8);
      std::allocator<char>::~allocator(&local_17e9);
    }
  }
  if (((local_be & 1U) == 0) && ((local_bd & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1898,"legalize-js-interface",&local_1899);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ::wasm::PassRunner::add(local_1690,local_1898,&local_18c8);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_18c8);
    std::__cxx11::string::~string(local_1898);
    std::allocator<char>::~allocator(&local_1899);
  }
  if ((onlyI64DynCalls & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_18f0,"strip-dwarf",&local_18f1);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    ::wasm::PassRunner::add(local_1690,local_18f0,&local_1920);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_1920);
    std::__cxx11::string::~string(local_18f0);
    std::allocator<char>::~allocator(&local_18f1);
  }
  ::wasm::PassRunner::run();
  bVar2 = ::wasm::isDebugEnabled("emscripten-dump");
  if ((bVar2 & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"Module after:\n");
  }
  bVar2 = ::wasm::isDebugEnabled("emscripten-dump");
  if ((bVar2 & 1) != 0) {
    poVar5 = (ostream *)std::operator<<((ostream *)&std::cerr,(Module *)&reader.profile);
    std::operator<<(poVar5,'\n');
  }
  if (bVar1 != false) {
    ::wasm::Output::Output
              ((Output *)(writer.sourceMapUrl.field_2._M_local_buf + 8),
               (string *)(inputSourceMapFilename.field_2._M_local_buf + 8),
               (byte)~minimizeWasmChanges & Text);
    ::wasm::ModuleWriter::ModuleWriter
              ((ModuleWriter *)local_1cb0,(PassOptions *)&options.field_0xb0);
    ::wasm::ModuleIOBase::setDebugInfo((ModuleIOBase *)local_1cb0,(bool)(noDynCalls & 1));
    ::wasm::ModuleWriter::setBinary((ModuleWriter *)local_1cb0,(bool)(minimizeWasmChanges & 1));
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      std::__cxx11::string::string
                ((string *)&local_1cd0,(string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
      ::wasm::ModuleWriter::setSourceMapFilename((ModuleWriter *)local_1cb0,&local_1cd0);
      std::__cxx11::string::~string((string *)&local_1cd0);
      std::__cxx11::string::string((string *)&local_1cf0,(string *)&standaloneWasm);
      ::wasm::ModuleWriter::setSourceMapUrl((ModuleWriter *)local_1cb0,&local_1cf0);
      std::__cxx11::string::~string((string *)&local_1cf0);
    }
    ::wasm::ModuleWriter::write((Module *)local_1cb0,(Output *)&reader.profile);
    ::wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_1cb0);
    ::wasm::Output::~Output((Output *)(writer.sourceMapUrl.field_2._M_local_buf + 8));
  }
  ::wasm::PassRunner::~PassRunner(local_1690);
  ::wasm::Module::~Module((Module *)&reader.profile);
  ::wasm::ToolOptions::~ToolOptions((ToolOptions *)local_280);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string((string *)&standaloneWasm);
  std::__cxx11::string::~string((string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(outputSourceMapFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(inputSourceMapFilename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(outfile.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string infile;
  std::string outfile;
  std::string inputSourceMapFilename;
  std::string outputSourceMapFilename;
  std::string outputSourceMapUrl;
  bool emitBinary = true;
  bool debugInfo = false;
  bool DWARF = false;
  bool sideModule = false;
  bool legalizeJavaScriptFFI = true;
  bool bigInt = false;
  bool checkStackOverflow = false;
  bool standaloneWasm = false;
  // TODO: remove after https://github.com/WebAssembly/binaryen/issues/3043
  bool minimizeWasmChanges = false;
  bool noDynCalls = false;
  bool onlyI64DynCalls = false;

  const std::string WasmEmscriptenFinalizeOption =
    "wasm-emscripten-finalize options";

  ToolOptions options("wasm-emscripten-finalize",
                      "Performs Emscripten-specific transforms on .wasm files");
  options
    .add("--output",
         "-o",
         "Output file",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&outfile](Options*, const std::string& argument) {
           outfile = argument;
           Colors::setEnabled(false);
         })
    .add("--debuginfo",
         "-g",
         "Emit names section in wasm binary (or full debuginfo in wast)",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&debugInfo](Options*, const std::string&) { debugInfo = true; })
    .add("--dwarf",
         "",
         "Update DWARF debug info",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&DWARF](Options*, const std::string&) { DWARF = true; })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file. "
         "In this mode if no output file is specified, we write to stdout.",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&emitBinary](Options*, const std::string&) { emitBinary = false; })
    .add("--side-module",
         "",
         "Input is an emscripten side module",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&sideModule](Options* o, const std::string& argument) {
           sideModule = true;
         })
    .add("--input-source-map",
         "-ism",
         "Consume source map from the specified file",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&inputSourceMapFilename](Options* o, const std::string& argument) {
           inputSourceMapFilename = argument;
         })
    .add("--no-legalize-javascript-ffi",
         "-nj",
         "Do not fully legalize (i64->i32, "
         "f32->f64) the imports and exports for interfacing with JS",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&legalizeJavaScriptFFI](Options* o, const std::string&) {
           legalizeJavaScriptFFI = false;
         })
    .add("--bigint",
         "-bi",
         "Assume JS will use wasm/JS BigInt integration, so wasm i64s will "
         "turn into JS BigInts, and there is no need for any legalization at "
         "all (not even minimal legalization of dynCalls)",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&bigInt](Options* o, const std::string&) { bigInt = true; })
    .add("--output-source-map",
         "-osm",
         "Emit source map to the specified file",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&outputSourceMapFilename](Options* o, const std::string& argument) {
           outputSourceMapFilename = argument;
         })
    .add("--output-source-map-url",
         "-osu",
         "Emit specified string as source map URL",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&outputSourceMapUrl](Options* o, const std::string& argument) {
           outputSourceMapUrl = argument;
         })
    .add("--check-stack-overflow",
         "",
         "Check for stack overflows every time the stack is extended",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&checkStackOverflow](Options* o, const std::string&) {
           checkStackOverflow = true;
         })
    .add("--standalone-wasm",
         "",
         "Emit a wasm file that does not depend on JS, as much as possible,"
         " using wasi and other standard conventions etc. where possible",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&standaloneWasm](Options* o, const std::string&) {
           standaloneWasm = true;
         })
    .add("--minimize-wasm-changes",
         "",
         "Modify the wasm as little as possible. This is useful during "
         "development as we reduce the number of changes to the wasm, as it "
         "lets emscripten control how much modifications to do.",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&minimizeWasmChanges](Options* o, const std::string&) {
           minimizeWasmChanges = true;
         })
    .add("--no-dyncalls",
         "",
         "",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&noDynCalls](Options* o, const std::string&) { noDynCalls = true; })
    .add("--dyncalls-i64",
         "",
         "",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&onlyI64DynCalls](Options* o, const std::string&) {
           onlyI64DynCalls = true;
         })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [&infile](Options* o, const std::string& argument) {
                      infile = argument;
                    });
  options.parse(argc, argv);

  if (infile == "") {
    Fatal() << "Need to specify an infile\n";
  }

  // We will write the modified wasm if the user asked us to, either by
  // specifying an output file or requesting text output (which goes to stdout
  // by default).
  auto writeOutput = outfile.size() > 0 || !emitBinary;

  Module wasm;
  options.applyOptionsBeforeParse(wasm);
  ModuleReader reader;
  // If we are not writing output then we definitely don't need to read debug
  // info. However, if we emit output then definitely load the names section so
  // that we roundtrip names properly.
  reader.setDebugInfo(writeOutput);
  reader.setDWARF(DWARF && writeOutput);
  if (!writeOutput) {
    // If we are not writing the output then all we are doing is simple parsing
    // of metadata from global parts of the wasm such as imports and exports. In
    // that case, it is unnecessary to parse function contents which are the
    // great bulk of the work, and we can skip all that.
    // Note that the one case we do need function bodies for, pthreads + EM_ASM
    // parsing, requires special handling. The start function has code that we
    // parse in order to find the EM_ASMs, and for that reason the binary reader
    // will still parse the start function even in this mode.
    reader.setSkipFunctionBodies(true);
  }
  try {
    reader.read(infile, wasm, inputSourceMapFilename);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error in parsing input";
  } catch (MapParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error in parsing wasm source map";
  }

  options.applyOptionsAfterParse(wasm);

  BYN_TRACE_WITH_TYPE("emscripten-dump", "Module before:\n");
  BYN_DEBUG_WITH_TYPE("emscripten-dump", std::cerr << &wasm);

  EmscriptenGlueGenerator generator(wasm);
  generator.standalone = standaloneWasm;
  generator.sideModule = sideModule;
  generator.minimizeWasmChanges = minimizeWasmChanges;
  generator.onlyI64DynCalls = onlyI64DynCalls;
  generator.noDynCalls = noDynCalls;

  PassRunner passRunner(&wasm, options.passOptions);
  passRunner.setDebug(options.debug);
  passRunner.setDebugInfo(debugInfo);

  if (checkStackOverflow) {
    if (!standaloneWasm) {
      // In standalone mode we don't set a handler at all.. which means
      // just trap on overflow.
      passRunner.options.arguments["stack-check-handler"] =
        "__handle_stack_overflow";
    }
    passRunner.add("stack-check");
  }

  if (!noDynCalls && !standaloneWasm) {
    // If not standalone wasm then JS is relevant and we need dynCalls.
    if (onlyI64DynCalls) {
      passRunner.add("generate-i64-dyncalls");
    } else {
      passRunner.add("generate-dyncalls");
    }
  }

  // Legalize the wasm, if BigInts don't make that moot.
  if (!bigInt && legalizeJavaScriptFFI) {
    passRunner.add("legalize-js-interface");
  }

  // If DWARF is unused, strip it out. This avoids us keeping it alive
  // until wasm-opt strips it later.
  if (!DWARF) {
    passRunner.add("strip-dwarf");
  }

  passRunner.run();

  BYN_TRACE_WITH_TYPE("emscripten-dump", "Module after:\n");
  BYN_DEBUG_WITH_TYPE("emscripten-dump", std::cerr << wasm << '\n');

  if (writeOutput) {
    Output output(outfile, emitBinary ? Flags::Binary : Flags::Text);
    ModuleWriter writer(options.passOptions);
    writer.setDebugInfo(debugInfo);
    // writer.setSymbolMap(symbolMap);
    writer.setBinary(emitBinary);
    if (outputSourceMapFilename.size()) {
      writer.setSourceMapFilename(outputSourceMapFilename);
      writer.setSourceMapUrl(outputSourceMapUrl);
    }
    writer.write(wasm, output);
  }
  return 0;
}